

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::SerializerTest_shouldSerializeLocaleIndependent_Test::TestBody
          (SerializerTest_shouldSerializeLocaleIndependent_Test *this)

{
  bool bVar1;
  char *message;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  AssertHelper local_d0;
  Message local_c8;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  string serialized;
  runtime_error *anon_var_0;
  unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_> local_20;
  unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_> local_18;
  unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_> localeWithCommaDecimalSeparator;
  SerializerTest_shouldSerializeLocaleIndependent_Test *this_local;
  
  localeWithCommaDecimalSeparator._M_t.
  super___uniq_ptr_impl<RAIILocale,_std::default_delete<RAIILocale>_>._M_t.
  super__Tuple_impl<0UL,_RAIILocale_*,_std::default_delete<RAIILocale>_>.
  super__Head_base<0UL,_RAIILocale_*,_false>._M_head_impl =
       (__uniq_ptr_data<RAIILocale,_std::default_delete<RAIILocale>,_true,_true>)
       (__uniq_ptr_data<RAIILocale,_std::default_delete<RAIILocale>,_true,_true>)this;
  std::unique_ptr<RAIILocale,std::default_delete<RAIILocale>>::
  unique_ptr<std::default_delete<RAIILocale>,void>
            ((unique_ptr<RAIILocale,std::default_delete<RAIILocale>> *)&local_18);
  detail::make_unique<RAIILocale,char_const(&)[12]>
            ((detail *)&local_20,(char (*) [12])"de_DE.UTF-8");
  std::unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_>::operator=(&local_18,&local_20);
  std::unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_>::~unique_ptr(&local_20);
  Serializer::Serialize_abi_cxx11_
            ((string *)&gtest_ar.message_,
             &(this->super_SerializerTest).textSerializer.super_Serializer,
             &(this->super_SerializerTest).collected);
  testing::HasSubstr<char[4]>(&local_c0,(StringLike<char[4]> *)0x20085f);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_a0,(internal *)&local_c0,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_80,(char *)&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_a0);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST_F(SerializerTest, shouldSerializeLocaleIndependent) {
  std::unique_ptr<RAIILocale> localeWithCommaDecimalSeparator;

  // ignore missing locale and skip test if setup fails
  try {
    localeWithCommaDecimalSeparator =
        detail::make_unique<RAIILocale>("de_DE.UTF-8");
  } catch (std::runtime_error&) {
    GTEST_SKIP();
  }

  const auto serialized = textSerializer.Serialize(collected);
  EXPECT_THAT(serialized, testing::HasSubstr(" 1\n"));
}